

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxNode *pSVar1;
  int iVar2;
  PropertyExprSyntax *pPVar3;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  SyntaxNode *pSVar4;
  AssertionExpr *clocking;
  AssertionExpr *disable;
  AssertionExpr *result;
  bool allowDisable;
  ASTContext ctx;
  AssertionExpr *local_60;
  bitmask<slang::ast::ASTFlags> local_50;
  undefined1 local_48 [8];
  ASTContext *in_stack_ffffffffffffffc0;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffc8;
  DisableIffSyntax *in_stack_ffffffffffffffd0;
  ASTContext *in_stack_ffffffffffffffe0;
  AssertionExpr *in_stack_ffffffffffffffe8;
  
  pSVar4 = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  memcpy(local_48,__addr,0x38);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_50,AssignmentDisallowed);
  bitmask<slang::ast::ASTFlags>::operator|=
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffc8,&local_50);
  pSVar1 = pSVar4[1].parent;
  pPVar3 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x9b25e5);
  iVar2 = bind((int)pPVar3,__addr,(uint)(pSVar1 == (SyntaxNode *)0x0));
  local_60 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
  if (pSVar4[1].parent != (SyntaxNode *)0x0) {
    local_60 = DisableIffAssertionExpr::fromSyntax
                         (in_stack_ffffffffffffffd0,
                          (AssertionExpr *)in_stack_ffffffffffffffc8.m_bits,
                          in_stack_ffffffffffffffc0);
    local_60->syntax = pSVar4[1].parent;
  }
  if (*(long *)(pSVar4 + 1) != 0) {
    local_60 = ClockingAssertionExpr::fromSyntax
                         ((TimingControlSyntax *)__addr,in_stack_ffffffffffffffe8,
                          in_stack_ffffffffffffffe0);
    local_60->syntax = *(SyntaxNode **)(pSVar4 + 1);
  }
  local_60->syntax = pSVar4;
  return (int)local_60;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertySpecSyntax& syntax,
                                         const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    bool allowDisable = syntax.disable == nullptr;
    auto result = &bind(*syntax.expr, context, allowDisable);

    if (syntax.disable) {
        auto& disable = DisableIffAssertionExpr::fromSyntax(*syntax.disable, *result, context);
        disable.syntax = syntax.disable;
        result = &disable;
    }

    if (syntax.clocking) {
        auto& clocking = ClockingAssertionExpr::fromSyntax(*syntax.clocking, *result, context);
        clocking.syntax = syntax.clocking;
        result = &clocking;
    }

    const_cast<AssertionExpr*>(result)->syntax = &syntax;
    return *result;
}